

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall
Text::Text(Text *this,FontFace face_,string *text_,FontColor color_,float x_,float y_,float z_,
          float windowScale_,float scale_,float kerning_)

{
  float kerning__local;
  float scale__local;
  float windowScale__local;
  float z__local;
  float y__local;
  float x__local;
  string *text__local;
  FontFace face__local;
  Text *this_local;
  FontColor color__local;
  
  this->x = 0.0;
  this->y = 0.0;
  this->z = 0.0;
  this->windowScale = 1.0;
  this->rotationX = 0.0;
  this->rotationY = 0.0;
  this->scale = 1.0;
  this->kerning = 0.0;
  std::__cxx11::string::string((string *)&this->text);
  this->color = &this->_color;
  this->texture = &this->_texture;
  texture_font_t::texture_font_t(&this->_font);
  Texture::Texture(&this->_texture);
  if (face_ == arial_16) {
    texture_font_t::operator=(&this->_font,&arial_16pt);
  }
  else if (face_ == arial_28) {
    texture_font_t::operator=(&this->_font,&arial_28pt);
  }
  else {
    if (face_ != arial_32) {
      printf("Unsupported font type");
      puts("");
      fflush(_stdout);
      exit(1);
    }
    texture_font_t::operator=(&this->_font,&arial_32pt);
  }
  (this->_color).b = color_.b;
  (this->_color).r = (char)color_._0_2_;
  (this->_color).g = (char)((ushort)color_._0_2_ >> 8);
  std::__cxx11::string::operator=((string *)&this->text,(string *)text_);
  this->x = x_;
  this->y = y_;
  this->z = z_;
  this->windowScale = windowScale_;
  this->scale = scale_;
  this->kerning = kerning_;
  return;
}

Assistant:

Text::Text(FontFace face_, std::string text_, FontColor color_, float x_, float y_, float z_, float windowScale_, float scale_, float kerning_) {
    switch(face_) {
    case FontFace::arial_16:  _font = arial_16pt; break;
    case FontFace::arial_28:  _font = arial_28pt; break;
    case FontFace::arial_32:  _font = arial_32pt; break;
    default:
        DEBUG_PRINTLN("Unsupported font type");
        exit(EXIT_FAILURE);
    }

    _color = color_;
    text = text_;
    x = x_;
    y = y_;
    z = z_;
    windowScale = windowScale_;
    scale = scale_;
    kerning = kerning_;
}